

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_partitioned.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  undefined8 uVar5;
  double *pdVar6;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  double dVar10;
  void *arkode_mem;
  SUNContext ctx;
  void *linear_mem;
  void *nonlinear_mem;
  sunrealtype tret;
  UserData user_data;
  SUNStepper steppers [2];
  long local_90;
  undefined8 local_88;
  long local_80;
  long local_78;
  double local_70;
  long local_68;
  double local_60;
  undefined8 local_58;
  undefined8 local_50 [2];
  double local_40;
  double local_38;
  
  if (argc < 2) {
    pcVar8 = "splitting";
  }
  else {
    pcVar8 = argv[1];
  }
  iVar2 = strcmp(pcVar8,"splitting");
  if ((iVar2 != 0) && (iVar2 = strcmp(pcVar8,"forcing"), iVar2 != 0)) {
    fprintf(_stderr,"Invalid integrator: %s\nMust be \'splitting\' or \'forcing\'\n",pcVar8);
    return 1;
  }
  if (argc < 3) {
    pcVar9 = (char *)0x0;
  }
  else {
    pcVar9 = argv[2];
  }
  local_60 = 2.0;
  uVar3 = SUNContext_Create(0,&local_88);
  if ((int)uVar3 < 0) {
    pcVar8 = "SUNContext_Create";
  }
  else {
    lVar4 = N_VNew_Serial(1,local_88);
    if (lVar4 == 0) {
      main_cold_7();
      return 1;
    }
    N_VConst(0x3ff0000000000000,lVar4);
    uVar5 = N_VClone(lVar4);
    pdVar6 = (double *)N_VGetArrayPointer(lVar4);
    local_38 = *pdVar6;
    local_70 = local_38 * local_60;
    local_40 = local_38 - local_60;
    dVar10 = exp(local_60);
    local_70 = local_70 / (local_38 - dVar10 * local_40);
    pdVar6 = (double *)N_VGetArrayPointer(uVar5);
    *pdVar6 = local_70;
    puts("\nAnalytical ODE test problem:");
    printf("   integrator = %s method\n",pcVar8);
    if (pcVar9 != (char *)0x0) {
      printf("   coefficients = %s\n",pcVar9);
    }
    printf("   lambda     = %g\n",local_60);
    local_80 = ERKStepCreate(0,f_linear,lVar4,local_88);
    if (local_80 == 0) {
      main_cold_6();
      return 1;
    }
    uVar3 = ARKodeSetUserData(local_80,&local_60);
    if ((int)uVar3 < 0) {
      pcVar8 = "ARKodeSetUserData";
    }
    else {
      uVar3 = ARKodeSetFixedStep(0x3f60624dd2f1a9fc,local_80);
      if (-1 < (int)uVar3) {
        local_78 = ARKStepCreate(0,f_nonlinear,0,lVar4,local_88);
        if (local_78 == 0) {
          main_cold_5();
          return 1;
        }
        uVar3 = ARKodeSetFixedStep(0x3f50624dd2f1a9fc,local_78);
        if (-1 < (int)uVar3) {
          ARKodeCreateSUNStepper(local_80,&local_58);
          ARKodeCreateSUNStepper(local_78,local_50);
          iVar2 = strcmp(pcVar8,"splitting");
          if (iVar2 == 0) {
            local_90 = SplittingStepCreate(0,&local_58,2,lVar4,local_88);
            if (local_90 == 0) {
              main_cold_4();
              return 1;
            }
            if (pcVar9 != (char *)0x0) {
              local_68 = SplittingStepCoefficients_LoadCoefficientsByName(pcVar9);
              if (local_68 == 0) {
                main_cold_2();
                iVar2 = 1;
                bVar1 = false;
              }
              else {
                uVar3 = SplittingStepSetCoefficients(local_90,local_68);
                if ((int)uVar3 < 0) {
                  bVar1 = false;
                  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                          "SplittingStepSetCoefficients",(ulong)uVar3);
                  iVar2 = 1;
                }
                else {
                  SplittingStepCoefficients_Destroy(&local_68);
                  iVar2 = 0;
                  bVar1 = true;
                }
              }
              if (!bVar1) {
                return iVar2;
              }
            }
          }
          else {
            local_90 = ForcingStepCreate(0,local_58,local_50[0],lVar4,local_88);
            if (local_90 == 0) {
              main_cold_1();
              return 1;
            }
          }
          uVar3 = ARKodeSetFixedStep(0x3f847ae147ae147b,local_90);
          if (-1 < (int)uVar3) {
            uVar3 = ARKodeEvolve(0x3ff0000000000000,local_90,lVar4,&local_68,1);
            if ((int)uVar3 < 0) {
              pcVar8 = "ARKodeEvolve";
            }
            else {
              lVar7 = N_VClone(lVar4);
              if (lVar7 == 0) {
                main_cold_3();
                return 1;
              }
              N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,lVar4,uVar5,lVar7);
              N_VMaxNorm(lVar7);
              printf("\nError: %g\n");
              puts("\nSplitting Stepper Statistics:");
              uVar3 = ARKodePrintAllStats(local_90,_stdout,0);
              if (-1 < (int)uVar3) {
                puts("\nLinear Stepper Statistics:");
                uVar3 = ARKodePrintAllStats(local_80,_stdout,0);
                if (-1 < (int)uVar3) {
                  puts("\nNonlinear Stepper Statistics:");
                  uVar3 = ARKodePrintAllStats(local_78,_stdout,0);
                  if (-1 < (int)uVar3) {
                    N_VDestroy(lVar4);
                    N_VDestroy(uVar5);
                    N_VDestroy(lVar7);
                    ARKodeFree(&local_80);
                    SUNStepper_Destroy(&local_58);
                    ARKodeFree(&local_78);
                    SUNStepper_Destroy(local_50);
                    ARKodeFree(&local_90);
                    SUNContext_Free(&local_88);
                    return 0;
                  }
                }
              }
              pcVar8 = "ARKodePrintAllStats";
            }
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar8,(ulong)uVar3);
            return 1;
          }
        }
      }
      pcVar8 = "ARKodeSetFixedStep";
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar8,(ulong)uVar3);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  /* Parse arguments */
  const char* integrator_name = (argc > 1) ? argv[1] : "splitting";
  if (strcmp(integrator_name, "splitting") != 0 &&
      strcmp(integrator_name, "forcing") != 0)
  {
    fprintf(stderr, "Invalid integrator: %s\nMust be 'splitting' or 'forcing'\n",
            integrator_name);
    return 1;
  }
  char* coefficients_name = (argc > 2) ? argv[2] : NULL;

  /* Problem parameters */
  sunrealtype t0           = SUN_RCONST(0.0);  /* initial time */
  sunrealtype tf           = SUN_RCONST(1.0);  /* final time */
  sunrealtype dt           = SUN_RCONST(0.01); /* outer time step */
  sunrealtype dt_linear    = dt / 5;           /* linear integrator time step */
  sunrealtype dt_nonlinear = dt / 10; /* nonlinear integrator time step */

  UserData user_data = {.lambda = SUN_RCONST(2.0)};

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  int flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initialize vector with initial condition */
  N_Vector y = N_VNew_Serial(1, ctx);
  if (check_flag(y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(1.0), y);

  N_Vector y_exact = exact_sol(y, tf, &user_data);

  printf("\nAnalytical ODE test problem:\n");
  printf("   integrator = %s method\n", integrator_name);
  if (coefficients_name != NULL)
  {
    printf("   coefficients = %s\n", coefficients_name);
  }
  printf("   lambda     = %" GSYM "\n", user_data.lambda);

  /* Create the integrator for the linear partition */
  void* linear_mem = ERKStepCreate(f_linear, t0, y, ctx);
  if (check_flag(linear_mem, "N_VNew_Serial", 0)) { return 1; }

  flag = ARKodeSetUserData(linear_mem, &user_data);
  if (check_flag(&flag, "ARKodeSetUserData", 1)) { return 1; }

  flag = ARKodeSetFixedStep(linear_mem, dt_linear);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create the integrator for the nonlinear partition */
  void* nonlinear_mem = ARKStepCreate(f_nonlinear, NULL, t0, y, ctx);
  if (check_flag(nonlinear_mem, "N_VNew_Serial", 0)) { return 1; }

  flag = ARKodeSetFixedStep(nonlinear_mem, dt_nonlinear);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create SUNSteppers out of the integrators */
  SUNStepper steppers[2];
  ARKodeCreateSUNStepper(linear_mem, &steppers[0]);
  ARKodeCreateSUNStepper(nonlinear_mem, &steppers[1]);

  /* Create the outer integrator */
  void* arkode_mem;
  if (strcmp(integrator_name, "splitting") == 0)
  {
    arkode_mem = SplittingStepCreate(steppers, 2, t0, y, ctx);
    if (check_flag(arkode_mem, "SplittingStepCreate", 0)) { return 1; }

    if (coefficients_name != NULL)
    {
      SplittingStepCoefficients coefficients =
        SplittingStepCoefficients_LoadCoefficientsByName(coefficients_name);
      if (check_flag(coefficients,
                     "SplittingStepCoefficients_LoadCoefficientsByName", 0))
      {
        return 1;
      }

      flag = SplittingStepSetCoefficients(arkode_mem, coefficients);
      if (check_flag(&flag, "SplittingStepSetCoefficients", 1)) { return 1; }

      SplittingStepCoefficients_Destroy(&coefficients);
    }
  }
  else
  {
    arkode_mem = ForcingStepCreate(steppers[0], steppers[1], t0, y, ctx);
    if (check_flag(arkode_mem, "ForcingStepCreate", 0)) { return 1; }
  }

  flag = ARKodeSetFixedStep(arkode_mem, dt);
  if (check_flag(&flag, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Compute the numerical solution */
  sunrealtype tret;
  flag = ARKodeEvolve(arkode_mem, tf, y, &tret, ARK_NORMAL);
  if (check_flag(&flag, "ARKodeEvolve", 1)) { return 1; }

  /* Print the numerical error and statistics */
  N_Vector y_err = N_VClone(y);
  if (check_flag(y_err, "N_VClone", 0)) { return 1; }
  N_VLinearSum(SUN_RCONST(1.0), y, -SUN_RCONST(1.0), y_exact, y_err);
  printf("\nError: %" GSYM "\n", N_VMaxNorm(y_err));

  printf("\nSplitting Stepper Statistics:\n");
  flag = ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  printf("\nLinear Stepper Statistics:\n");
  flag = ARKodePrintAllStats(linear_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  printf("\nNonlinear Stepper Statistics:\n");
  flag = ARKodePrintAllStats(nonlinear_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  if (check_flag(&flag, "ARKodePrintAllStats", 1)) { return 1; }

  /* Free memory */
  N_VDestroy(y);
  N_VDestroy(y_exact);
  N_VDestroy(y_err);
  ARKodeFree(&linear_mem);
  SUNStepper_Destroy(&steppers[0]);
  ARKodeFree(&nonlinear_mem);
  SUNStepper_Destroy(&steppers[1]);
  ARKodeFree(&arkode_mem);
  SUNContext_Free(&ctx);

  return 0;
}